

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

double expected_separation_depth(size_t n)

{
  ulong in_RDI;
  double local_8;
  
  switch(in_RDI) {
  case 0:
    local_8 = 0.0;
    break;
  case 1:
    local_8 = 0.0;
    break;
  case 2:
    local_8 = 1.0;
    break;
  case 3:
    local_8 = 1.3333333333333333;
    break;
  case 4:
    local_8 = 1.5555555555555554;
    break;
  case 5:
    local_8 = 1.71666666667;
    break;
  case 6:
    local_8 = 1.84;
    break;
  case 7:
    local_8 = 1.93809524;
    break;
  case 8:
    local_8 = 2.01836735;
    break;
  case 9:
    local_8 = 2.08551587;
    break;
  case 10:
    local_8 = 2.14268078;
    break;
  default:
    if (in_RDI < 0x15676) {
      local_8 = expected_separation_depth_hotstart(2.14268078,10,in_RDI);
    }
    else {
      local_8 = 3.0;
    }
  }
  return local_8;
}

Assistant:

double expected_separation_depth(size_t n)
{
    switch(n)
    {
        case 0: return 0.;
        case 1: return 0.;
        case 2: return 1.;
        case 3: return 1. + (1./3.);
        case 4: return 1. + (1./3.) + (2./9.);
        case 5: return 1.71666666667;
        case 6: return 1.84;
        case 7: return 1.93809524;
        case 8: return 2.01836735;
        case 9: return 2.08551587;
        case 10: return 2.14268078;
        default:
        {
            if (n >= THRESHOLD_EXACT_S)
                return 3;
            else
                return expected_separation_depth_hotstart((double)2.14268078, (size_t)10, n);
        }
    }
}